

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  bool bVar7;
  Command_conflict *pCVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  long lVar18;
  byte bVar19;
  undefined4 uVar20;
  uint8_t *puVar21;
  int *piVar22;
  BrotliEncoderDictionary *pBVar23;
  uint8_t *local_b30;
  uint8_t *local_b20;
  uint8_t *local_b10;
  uint8_t *local_b08;
  uint8_t *local_af8;
  uint8_t *local_ae0;
  uint8_t *local_ad0;
  ulong local_ac8;
  ulong local_ac0;
  uint8_t *local_ab0;
  uint8_t *local_aa8;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_a38;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t max_backward_limit;
  HasherHandle hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t score_4;
  size_t len_4;
  size_t backward_2;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  int compare_char_1;
  uint32_t key_2;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  H2 *self_2;
  size_t score_1;
  size_t len_1;
  size_t backward;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  int compare_char;
  uint32_t key;
  size_t cur_ix_masked;
  size_t best_len_in;
  H2 *self;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_728;
  uint32_t delta;
  uint8_t *local_6b8;
  size_t i_2;
  uint32_t off;
  uint32_t key_4;
  uint32_t off_2;
  uint32_t key_6;
  uint32_t off_1;
  uint32_t key_5;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_5c0;
  size_t local_5b0;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_580;
  size_t local_570;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_540;
  size_t local_530;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_500;
  size_t local_4f0;
  int item_matches;
  size_t item;
  HasherCommon *self_1;
  size_t i;
  size_t key_1;
  int item_matches_1;
  size_t item_1;
  HasherCommon *self_3;
  size_t i_1;
  size_t key_3;
  uint32_t h_1;
  uint32_t h;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_3;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_258;
  size_t local_248;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_1;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_160;
  size_t local_150;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_5a;
  uint32_t nbits_2;
  ushort local_32;
  int offset_3;
  uint16_t bits64;
  ushort local_a;
  
  pCVar8 = commands;
  puVar11 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar12 = (uint8_t *)(position + num_bytes);
  local_aa8 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_aa8 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar10 = 0x200;
  if (params->quality < 9) {
    iVar10 = 0x40;
  }
  lVar13 = (long)iVar10;
  gap = position + lVar13;
  puVar17 = (uint8_t *)position;
LAB_0011fac0:
  do {
    ringbuffer_local = puVar17;
    if (puVar12 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar12 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar8 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar12 - (long)ringbuffer_local;
    local_ab0 = puVar11;
    if (ringbuffer_local < puVar11) {
      local_ab0 = ringbuffer_local;
    }
    sStack_a38 = 0;
    sr.score = 0;
    sr.len = 0;
    sr.distance = 0x7e4;
    pBVar23 = &params->dictionary;
    puVar17 = (uint8_t *)(params->dist).max_distance;
    uVar14 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar9 = HashBytesH2(ringbuffer + uVar14);
    uVar1 = ringbuffer[uVar14];
    iVar10 = *dist_cache;
    sr.score._0_4_ = 0;
    uVar20 = SUB84(ringbuffer_local,0);
    if ((ringbuffer_local + -(long)iVar10 < ringbuffer_local) &&
       (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)iVar10),
       uVar1 == ringbuffer[uVar15])) {
      local_5c0 = (ulong *)(ringbuffer + uVar14);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_0011fda9:
      x = x - 1;
      if (x != 0) {
        if (*local_5c0 == *(ulong *)(ringbuffer + limit2 + uVar15)) break;
        iVar5 = 0;
        for (uVar15 = *local_5c0 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
            uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar5 = iVar5 + 1;
        }
        local_5b0 = ((ulong)(long)iVar5 >> 3) + limit2;
        goto LAB_0011ff4c;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_5c0) {
          local_5b0 = limit2;
          goto LAB_0011ff4c;
        }
        local_5c0 = (ulong *)((long)local_5c0 + 1);
        limit2 = limit2 + 1;
      }
      local_5b0 = limit2;
LAB_0011ff4c:
      if ((local_5b0 < 4) || (uVar15 = local_5b0 * 0x87 + 0x78f, uVar15 < 0x7e5)) goto LAB_0012003a;
      sStack_a38 = local_5b0;
      *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
      sr.len = (long)iVar10;
      sr.distance = uVar15;
    }
    else {
LAB_0012003a:
      uVar3 = *(uint *)(hasher + (ulong)uVar9 * 4 + 0x28);
      *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
      puVar21 = ringbuffer_local + -(ulong)uVar3;
      uVar15 = ringbuffer_mask & 0xffffffff & (ulong)uVar3;
      if ((uVar1 == ringbuffer[uVar15]) && (puVar21 != (uint8_t *)0x0 && puVar21 <= local_ab0)) {
        local_580 = (ulong *)(ringbuffer + uVar14);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00120151:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_580 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_001201b3;
          iVar10 = 0;
          for (uVar15 = *local_580 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_570 = ((ulong)(long)iVar10 >> 3) + limit2_1;
          goto LAB_001202f4;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_580) {
            local_570 = limit2_1;
            goto LAB_001202f4;
          }
          local_580 = (ulong *)((long)local_580 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_570 = limit2_1;
LAB_001202f4:
        if (3 < local_570) {
          iVar10 = 0x1f;
          if ((uint)puVar21 != 0) {
            for (; (uint)puVar21 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar15 = (local_570 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
          if (0x7e4 < uVar15) {
            sStack_a38 = local_570;
            sr.len = (size_t)puVar21;
            sr.distance = uVar15;
            goto LAB_00120a3b;
          }
        }
        piVar22 = (int *)(ringbuffer + uVar14);
        if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
          i = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
          bVar7 = false;
          while (!bVar7) {
            uVar2 = (params->dictionary).hash_table[i];
            uVar14 = (ulong)uVar2;
            *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
            if (uVar14 != 0) {
              uVar15 = uVar14 & 0x1f;
              uVar16 = (ulong)(uVar2 >> 5);
              if (max_distance < uVar15) {
                bVar7 = false;
              }
              else {
                local_160 = (ulong *)(pBVar23->words->data +
                                     (ulong)pBVar23->words->offsets_by_length[uVar15] +
                                     uVar15 * uVar16);
                limit2_2 = 0;
                x_2 = (uVar15 >> 3) + 1;
LAB_0012066b:
                x_2 = x_2 - 1;
                if (x_2 != 0) {
                  if (*local_160 == *(ulong *)((long)piVar22 + limit2_2)) goto LAB_001206cd;
                  iVar10 = 0;
                  for (uVar14 = *local_160 ^ *(ulong *)((long)piVar22 + limit2_2); (uVar14 & 1) == 0
                      ; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                    iVar10 = iVar10 + 1;
                  }
                  local_150 = ((ulong)(long)iVar10 >> 3) + limit2_2;
                  goto LAB_0012080e;
                }
                matched_2 = (uVar14 & 7) + 1;
                while (matched_2 = matched_2 - 1, matched_2 != 0) {
                  if (*(char *)((long)piVar22 + limit2_2) != (char)*local_160) {
                    local_150 = limit2_2;
                    goto LAB_0012080e;
                  }
                  local_160 = (ulong *)((long)local_160 + 1);
                  limit2_2 = limit2_2 + 1;
                }
                local_150 = limit2_2;
LAB_0012080e:
                if ((uVar15 < local_150 + (params->dictionary).cutoffTransformsCount) &&
                   (local_150 != 0)) {
                  puVar21 = local_ab0 +
                            ((uVar15 - local_150) * 4 +
                             ((params->dictionary).cutoffTransforms >>
                              ((char)(uVar15 - local_150) * '\x06' & 0x3fU) & 0x3f) <<
                            (pBVar23->words->size_bits_by_length[uVar15] & 0x3f)) + uVar16 + 1;
                  if (puVar17 < puVar21) {
                    bVar7 = false;
                  }
                  else {
                    iVar10 = 0x1f;
                    if ((uint)puVar21 != 0) {
                      for (; (uint)puVar21 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                      }
                    }
                    uVar14 = (local_150 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                    if (uVar14 < sr.distance) {
                      bVar7 = false;
                    }
                    else {
                      sStack_a38 = local_150;
                      sr.score._0_4_ = (int)uVar15 - (int)local_150;
                      bVar7 = true;
                      sr.len = (size_t)puVar21;
                      sr.distance = uVar14;
                    }
                  }
                }
                else {
                  bVar7 = false;
                }
              }
              if (bVar7) {
                *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
              }
            }
            i = i + 1;
            bVar7 = true;
          }
        }
        *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
      }
    }
LAB_00120a3b:
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_ac0 = sStack_a38 - 1;
          if (max_distance <= local_ac0) {
            local_ac0 = max_distance;
          }
          local_ac8 = local_ac0;
        }
        else {
          local_ac8 = 0;
        }
        distance_code = local_ac8;
        sr2.len = 0;
        sr2.distance = 0x7e4;
        local_ad0 = puVar11;
        if (ringbuffer_local + 1 < puVar11) {
          local_ad0 = ringbuffer_local + 1;
        }
        pBVar23 = &params->dictionary;
        puVar21 = ringbuffer_local + 1;
        puVar17 = (uint8_t *)(params->dist).max_distance;
        uVar14 = (ulong)puVar21 & ringbuffer_mask;
        uVar9 = HashBytesH2(ringbuffer + uVar14);
        uVar1 = ringbuffer[uVar14 + local_ac8];
        iVar10 = *dist_cache;
        sr2.score._0_4_ = 0;
        uVar20 = SUB84(puVar21,0);
        if ((puVar21 + -(long)iVar10 < puVar21) &&
           (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(puVar21 + -(long)iVar10),
           uVar1 == ringbuffer[uVar15 + local_ac8])) {
          local_540 = (ulong *)(ringbuffer + uVar14);
          limit2_3 = 0;
          x_3 = (max_distance >> 3) + 1;
LAB_00120db0:
          x_3 = x_3 - 1;
          if (x_3 != 0) {
            if (*local_540 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_00120e12;
            iVar5 = 0;
            for (uVar15 = *local_540 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15); (uVar15 & 1) == 0
                ; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              iVar5 = iVar5 + 1;
            }
            local_530 = ((ulong)(long)iVar5 >> 3) + limit2_3;
            goto LAB_00120f53;
          }
          matched_3 = (max_distance & 7) + 1;
          while (matched_3 = matched_3 - 1, matched_3 != 0) {
            if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_540) {
              local_530 = limit2_3;
              goto LAB_00120f53;
            }
            local_540 = (ulong *)((long)local_540 + 1);
            limit2_3 = limit2_3 + 1;
          }
          local_530 = limit2_3;
LAB_00120f53:
          if ((local_530 < 4) || (uVar15 = local_530 * 0x87 + 0x78f, uVar15 < 0x7e5))
          goto LAB_00121041;
          distance_code = local_530;
          *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
          sr2.len = (long)iVar10;
          sr2.distance = uVar15;
        }
        else {
LAB_00121041:
          uVar3 = *(uint *)(hasher + (ulong)uVar9 * 4 + 0x28);
          *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
          puVar21 = puVar21 + -(ulong)uVar3;
          uVar15 = ringbuffer_mask & 0xffffffff & (ulong)uVar3;
          if ((uVar1 == ringbuffer[uVar15 + local_ac8]) &&
             (puVar21 != (uint8_t *)0x0 && puVar21 <= local_ad0)) {
            local_500 = (ulong *)(ringbuffer + uVar14);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_00121158:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_500 == *(ulong *)(ringbuffer + limit2_4 + uVar15)) goto LAB_001211ba;
              iVar10 = 0;
              for (uVar15 = *local_500 ^ *(ulong *)(ringbuffer + limit2_4 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_4f0 = ((ulong)(long)iVar10 >> 3) + limit2_4;
              goto LAB_001212fb;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar15] != (uint8_t)*local_500) {
                local_4f0 = limit2_4;
                goto LAB_001212fb;
              }
              local_500 = (ulong *)((long)local_500 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_4f0 = limit2_4;
LAB_001212fb:
            if (3 < local_4f0) {
              iVar10 = 0x1f;
              if ((uint)puVar21 != 0) {
                for (; (uint)puVar21 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                }
              }
              uVar15 = (local_4f0 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
              if (0x7e4 < uVar15) {
                distance_code = local_4f0;
                sr2.len = (size_t)puVar21;
                sr2.distance = uVar15;
                goto LAB_00121a42;
              }
            }
            piVar22 = (int *)(ringbuffer + uVar14);
            if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
              i_1 = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
              bVar7 = false;
              while (!bVar7) {
                uVar2 = (params->dictionary).hash_table[i_1];
                uVar14 = (ulong)uVar2;
                *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
                if (uVar14 != 0) {
                  uVar15 = uVar14 & 0x1f;
                  uVar16 = (ulong)(uVar2 >> 5);
                  if (max_distance < uVar15) {
                    bVar7 = false;
                  }
                  else {
                    local_258 = (ulong *)(pBVar23->words->data +
                                         (ulong)pBVar23->words->offsets_by_length[uVar15] +
                                         uVar15 * uVar16);
                    limit2_5 = 0;
                    x_5 = (uVar15 >> 3) + 1;
LAB_00121672:
                    x_5 = x_5 - 1;
                    if (x_5 != 0) {
                      if (*local_258 == *(ulong *)((long)piVar22 + limit2_5)) goto LAB_001216d4;
                      iVar10 = 0;
                      for (uVar14 = *local_258 ^ *(ulong *)((long)piVar22 + limit2_5);
                          (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                        iVar10 = iVar10 + 1;
                      }
                      local_248 = ((ulong)(long)iVar10 >> 3) + limit2_5;
                      goto LAB_00121815;
                    }
                    matched_5 = (uVar14 & 7) + 1;
                    while (matched_5 = matched_5 - 1, matched_5 != 0) {
                      if (*(char *)((long)piVar22 + limit2_5) != (char)*local_258) {
                        local_248 = limit2_5;
                        goto LAB_00121815;
                      }
                      local_258 = (ulong *)((long)local_258 + 1);
                      limit2_5 = limit2_5 + 1;
                    }
                    local_248 = limit2_5;
LAB_00121815:
                    if ((uVar15 < local_248 + (params->dictionary).cutoffTransformsCount) &&
                       (local_248 != 0)) {
                      puVar21 = local_ad0 +
                                ((uVar15 - local_248) * 4 +
                                 ((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar15 - local_248) * '\x06' & 0x3fU) & 0x3f) <<
                                (pBVar23->words->size_bits_by_length[uVar15] & 0x3f)) + uVar16 + 1;
                      if (puVar17 < puVar21) {
                        bVar7 = false;
                      }
                      else {
                        iVar10 = 0x1f;
                        if ((uint)puVar21 != 0) {
                          for (; (uint)puVar21 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                          }
                        }
                        uVar14 = (local_248 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                        if (uVar14 < sr2.distance) {
                          bVar7 = false;
                        }
                        else {
                          distance_code = local_248;
                          sr2.score._0_4_ = (int)uVar15 - (int)local_248;
                          bVar7 = true;
                          sr2.len = (size_t)puVar21;
                          sr2.distance = uVar14;
                        }
                      }
                    }
                    else {
                      bVar7 = false;
                    }
                  }
                  if (bVar7) {
                    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
                  }
                }
                i_1 = i_1 + 1;
                bVar7 = true;
              }
            }
            *(undefined4 *)(hasher + (ulong)uVar9 * 4 + 0x28) = uVar20;
          }
        }
LAB_00121a42:
        puVar17 = ringbuffer_local;
        uVar3 = (uint)sr.score;
        if (sr2.distance < sr.distance + 0xaf) goto LAB_00121ae8;
        puVar17 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_a38 = distance_code;
        sr.len = sr2.len;
        sr.distance = sr2.distance;
        sr.score = (size_t)(uint)sr2.score;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        uVar3 = (uint)sr2.score;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar21 = ringbuffer_local + 9, ringbuffer_local = puVar17, puVar12 <= puVar21))
        goto LAB_00121ae8;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar17 = ringbuffer_local + 1;
    if (gap < puVar17) {
      if ((uint8_t *)(gap + lVar13 * 4) < puVar17) {
        puVar21 = ringbuffer_local + 0x11;
        local_b20 = puVar12 + -7;
        ringbuffer_local = puVar17;
        if (puVar21 < local_b20) {
          local_b20 = puVar21;
        }
        for (; puVar17 = ringbuffer_local, ringbuffer_local < local_b20;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar9 = HashBytesH2(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)uVar9 * 4 + 0x28) = (int)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar21 = ringbuffer_local + 9;
        local_b30 = puVar12 + -7;
        ringbuffer_local = puVar17;
        if (puVar21 < local_b30) {
          local_b30 = puVar21;
        }
        for (; puVar17 = ringbuffer_local, ringbuffer_local < local_b30;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar9 = HashBytesH2(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)uVar9 * 4 + 0x28) = (int)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_5c0 = local_5c0 + 1;
  limit2 = limit2 + 8;
  goto LAB_0011fda9;
LAB_001201b3:
  local_580 = local_580 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00120151;
LAB_001206cd:
  local_160 = local_160 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0012066b;
LAB_00120e12:
  local_540 = local_540 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00120db0;
LAB_001211ba:
  local_500 = local_500 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00121158;
LAB_001216d4:
  local_258 = local_258 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_00121672;
LAB_00121ae8:
  sr.score._0_4_ = uVar3;
  ringbuffer_local = puVar17;
  gap = (size_t)(ringbuffer_local + lVar13 + sStack_a38 * 2);
  local_ae0 = puVar11;
  if (ringbuffer_local < puVar11) {
    local_ae0 = ringbuffer_local;
  }
  if (sr.len <= local_ae0) {
    uVar14 = (sr.len + 3) - (long)*dist_cache;
    uVar15 = (sr.len + 3) - (long)dist_cache[1];
    if (sr.len == (long)*dist_cache) {
      local_728 = 0;
      goto LAB_00121d0b;
    }
    if (sr.len == (long)dist_cache[1]) {
      local_728 = 1;
      goto LAB_00121d0b;
    }
    if (uVar14 < 7) {
      local_728 = (ulong)(int)(0x9750468 >> ((byte)((uVar14 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00121d0b;
    }
    if (uVar15 < 7) {
      local_728 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar15 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00121d0b;
    }
    if (sr.len == (long)dist_cache[2]) {
      local_728 = 2;
      goto LAB_00121d0b;
    }
    if (sr.len == (long)dist_cache[3]) {
      local_728 = 3;
      goto LAB_00121d0b;
    }
  }
  local_728 = sr.len + 0xf;
LAB_00121d0b:
  if ((sr.len <= local_ae0) && (local_728 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len;
  }
  uVar9 = (uint32_t)pos_end;
  commands->insert_len_ = uVar9;
  commands->copy_len_ = (uint)sStack_a38 | (uint)sr.score << 0x19;
  uVar3 = (params->dist).num_direct_distance_codes;
  uVar4 = (params->dist).distance_postfix_bits;
  if (local_728 < (ulong)uVar3 + 0x10) {
    commands->dist_prefix_ = (uint16_t)local_728;
    commands->dist_extra_ = 0;
  }
  else {
    bVar6 = (byte)uVar4;
    uVar14 = (1L << (bVar6 + 2 & 0x3f)) + ((local_728 - 0x10) - (ulong)uVar3);
    iVar10 = 0x1f;
    if ((uint)uVar14 != 0) {
      for (; (uint)uVar14 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    bVar19 = (byte)(iVar10 - 1U);
    uVar15 = uVar14 >> (bVar19 & 0x3f) & 1;
    lVar18 = (ulong)(iVar10 - 1U) - (ulong)uVar4;
    commands->dist_prefix_ =
         (short)lVar18 * 0x400 |
         (short)uVar3 + 0x10 + (short)((lVar18 + -1) * 2 + uVar15 << (bVar6 & 0x3f)) +
         ((ushort)uVar14 & (short)(1 << (bVar6 & 0x1f)) - 1U);
    commands->dist_extra_ = (uint32_t)(uVar14 - (uVar15 + 2 << (bVar19 & 0x3f)) >> (bVar6 & 0x3f));
  }
  iVar10 = (uint)sStack_a38 + (uint)sr.score;
  uVar14 = (ulong)iVar10;
  if (pos_end < 6) {
    local_5a = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar5 = 0x1f;
    if (uVar9 - 2 != 0) {
      for (; uVar9 - 2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_5a = (short)(iVar5 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar5 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar5 = 0x1f;
    if (uVar9 - 0x42 != 0) {
      for (; uVar9 - 0x42 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_5a = (short)iVar5 + 10;
  }
  else if (pos_end < 0x1842) {
    local_5a = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_5a = 0x16;
  }
  else {
    local_5a = 0x17;
  }
  if (uVar14 < 10) {
    local_32 = (short)iVar10 - 2;
  }
  else if (uVar14 < 0x86) {
    iVar5 = 0x1f;
    if (iVar10 - 6U != 0) {
      for (; iVar10 - 6U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_32 = (short)(iVar5 + -1) * 2 + (short)(uVar14 - 6 >> ((byte)(iVar5 + -1) & 0x3f)) + 4;
  }
  else if (uVar14 < 0x846) {
    iVar5 = 0x1f;
    if (iVar10 - 0x46U != 0) {
      for (; iVar10 - 0x46U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_32 = (short)iVar5 + 0xc;
  }
  else {
    local_32 = 0x17;
  }
  local_a = local_32 & 7 | (local_5a & 7) << 3;
  if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_5a < 8)) && (local_32 < 0x10)) {
    if (7 < local_32) {
      local_a = local_a | 0x40;
    }
  }
  else {
    iVar10 = ((int)(uint)local_32 >> 3) + ((int)(uint)local_5a >> 3) * 3;
    local_a = (short)iVar10 * 0x40 + 0x40 +
              ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) | local_a;
  }
  commands->cmd_prefix_ = local_a;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  range_end = (size_t)(ringbuffer_local + 2);
  local_af8 = ringbuffer_local + sStack_a38;
  if (local_aa8 <= local_af8) {
    local_af8 = local_aa8;
  }
  if (sr.len < sStack_a38 >> 2) {
    local_b08 = ringbuffer_local + sr.len * -4 + sStack_a38;
    if (local_b08 < range_end) {
      local_b08 = (uint8_t *)range_end;
    }
    if (local_af8 < local_b08) {
      local_b10 = local_af8;
    }
    else {
      local_b10 = local_b08;
    }
    range_end = (size_t)local_b10;
  }
  for (local_6b8 = (uint8_t *)range_end; local_6b8 < local_af8; local_6b8 = local_6b8 + 1) {
    uVar9 = HashBytesH2(ringbuffer + ((ulong)local_6b8 & ringbuffer_mask));
    *(int *)(hasher + (ulong)uVar9 * 4 + 0x28) = (int)local_6b8;
  }
  commands = commands + 1;
  puVar17 = ringbuffer_local + sStack_a38;
  goto LAB_0011fac0;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}